

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall
FIX::DataDictionary::addGroup
          (DataDictionary *this,string *msg,int field,int delim,DataDictionary *dataDictionary)

{
  DataDictionary *this_00;
  mapped_type *this_01;
  mapped_type *pmVar1;
  int local_4c;
  string local_48;
  
  local_4c = field;
  this_00 = (DataDictionary *)operator_new(0x3e0);
  DataDictionary(this_00,dataDictionary);
  std::__cxx11::string::string
            ((string *)&local_48,
             (string *)&(this->m_beginString).super_StringField.super_FieldBase.m_string);
  setVersion(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this_01 = std::
            map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>_>_>_>
            ::operator[](&this->m_groups,&local_4c);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>
           ::operator[](this_01,msg);
  pmVar1->first = delim;
  pmVar1->second = this_00;
  return;
}

Assistant:

void addGroup(const std::string &msg, int field, int delim, const DataDictionary &dataDictionary) {
    DataDictionary *pDD = new DataDictionary(dataDictionary);
    pDD->setVersion(getVersion());

    FieldPresenceMap &presenceMap = m_groups[field];
    presenceMap[msg] = std::make_pair(delim, pDD);
  }